

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O2

void __thiscall
Test::HTMLOutput::generateSuitesTable(HTMLOutput *this,ostream *stream,bool includePassed)

{
  ostream *poVar1;
  string *psVar2;
  double dVar3;
  string local_50;
  
  poVar1 = std::operator<<(stream,
                           "<table id=\'top\' class=\'suites\'><tr><th>Suite</th><th># Tests</th><th>Passed Tests</th><th>Duration</th></tr>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  for (psVar2 = *(string **)(this + 8); psVar2 != *(string **)(this + 0x10); psVar2 = psVar2 + 0x48)
  {
    if ((includePassed) || (*(int *)(psVar2 + 0x44) != *(int *)(psVar2 + 0x40))) {
      poVar1 = std::operator<<(stream,"<tr><td><a href=\'#suite_");
      poVar1 = std::operator<<(poVar1,psVar2);
      poVar1 = std::operator<<(poVar1,"\'>");
      poVar1 = std::operator<<(poVar1,psVar2);
      poVar1 = std::operator<<(poVar1,"</a></td>");
      poVar1 = std::operator<<(poVar1,"<td>");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,"</td>");
      poVar1 = std::operator<<(poVar1,"<td class=\'");
      getCssClass_abi_cxx11_
                (&local_50,(ulong)*(uint *)(psVar2 + 0x40),(ulong)*(uint *)(psVar2 + 0x44));
      poVar1 = std::operator<<(poVar1,(string *)&local_50);
      poVar1 = std::operator<<(poVar1,"\'>");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," (");
      dVar3 = Output::prettifyPercentage
                        ((Output *)this,(double)*(uint *)(psVar2 + 0x44),
                         (double)*(uint *)(psVar2 + 0x40));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      poVar1 = std::operator<<(poVar1,"%)</td>");
      std::operator<<(poVar1,"<td>");
      poVar1 = std::ostream::_M_insert<double>((double)*(long *)(psVar2 + 0x20) / 1000.0);
      std::operator<<(poVar1," ms (");
      poVar1 = std::ostream::_M_insert<double>((double)*(long *)(psVar2 + 0x20) / 1000000.0);
      poVar1 = std::operator<<(poVar1," s)</td>");
      poVar1 = std::operator<<(poVar1,"</tr>");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string(&local_50);
    }
  }
  poVar1 = std::operator<<(stream,"</table>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void HTMLOutput::generateSuitesTable(std::ostream &stream, bool includePassed) {
  // header
  stream
      << "<table id='top' class='suites'><tr><th>Suite</th><th># Tests</th><th>Passed Tests</th><th>Duration</th></tr>"
      << std::endl;
  // content
  auto info = suites.begin();
  while (info != suites.end()) {
    if (includePassed || info->numPositiveTests != info->numTests) {
      stream << "<tr><td><a href='#suite_" << info->suiteName << "'>" << info->suiteName << "</a></td>"
             << "<td>" << info->numTests << "</td>"
             << "<td class='" << getCssClass(info->numTests, info->numPositiveTests) << "'>" << info->numPositiveTests
             << " (" << prettifyPercentage(info->numPositiveTests, info->numTests) << "%)</td>"
             << "<td>" << static_cast<double>(info->suiteDuration.count()) / 1000.0 << " ms ("
             << static_cast<double>(info->suiteDuration.count()) / 1000000.0 << " s)</td>"
             << "</tr>" << std::endl;
    }
    ++info;
  }
  stream << "</table>" << std::endl;
}